

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkcs12_test.cc
# Opt level: O3

void __thiscall PKCS12Test_Order_Test::TestBody(PKCS12Test_Order_Test *this)

{
  undefined1 auVar1 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  undefined8 uVar3;
  _Head_base<0UL,_evp_pkey_st_*,_false> _Var4;
  bool bVar5;
  _Head_base<0UL,_x509_st_*,_false> __ptr_00;
  char *in_R9;
  pointer *__ptr;
  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  initializer_list<x509_st_*> __l;
  initializer_list<x509_st_*> __l_00;
  initializer_list<x509_st_*> __l_01;
  initializer_list<x509_st_*> __l_02;
  initializer_list<x509_st_*> __l_03;
  initializer_list<x509_st_*> __l_04;
  initializer_list<x509_st_*> __l_05;
  initializer_list<x509_st_*> __l_06;
  initializer_list<x509_st_*> __l_07;
  initializer_list<x509_st_*> __l_08;
  initializer_list<x509_st_*> __l_09;
  initializer_list<x509_st_*> __l_10;
  Span<const_unsigned_char> in;
  Span<const_unsigned_char> in_00;
  Span<const_unsigned_char> in_01;
  Span<const_unsigned_char> in_02;
  Span<const_unsigned_char> in_03;
  Span<const_unsigned_char> in_04;
  vector<unsigned_char,_std::allocator<unsigned_char>_> p12;
  UniquePtr<X509> cert2;
  UniquePtr<X509> cert1;
  UniquePtr<EVP_PKEY> key1;
  UniquePtr<X509> cert3;
  UniquePtr<X509> cert1b;
  UniquePtr<EVP_PKEY> key3;
  UniquePtr<EVP_PKEY> key2;
  string local_c0;
  _Head_base<0UL,_x509_st_*,_false> local_a0;
  _Head_base<0UL,_x509_st_*,_false> local_98;
  AssertHelper local_90;
  undefined1 local_88 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbStack_80;
  pointer local_78;
  _Head_base<0UL,_x509_st_*,_false> local_70;
  _Head_base<0UL,_x509_st_*,_false> local_68;
  _Head_base<0UL,_x509_st_*,_false> local_60;
  undefined1 local_58 [16];
  _Head_base<0UL,_evp_pkey_st_*,_false> local_48;
  undefined1 local_40 [16];
  __uniq_ptr_impl<evp_pkey_st,_bssl::internal::Deleter> local_30;
  unique_ptr<evp_pkey_st,_bssl::internal::Deleter> local_28;
  
  MakeTestKey();
  local_88[0] = (EVP_PKEY_ASN1_METHOD *)local_48._M_head_impl != (EVP_PKEY_ASN1_METHOD *)0x0;
  pbStack_80 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if ((EVP_PKEY_ASN1_METHOD *)local_48._M_head_impl == (EVP_PKEY_ASN1_METHOD *)0x0) {
    testing::Message::Message((Message *)&local_70);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_c0,(internal *)local_88,(AssertionResult *)0x524fa0,"false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_a0,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs8/pkcs12_test.cc"
               ,0x231,local_c0._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_a0,(Message *)&local_70);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_a0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
      operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
    }
    if (local_70._M_head_impl != (X509 *)0x0) {
      (**(code **)(((_Alloc_hider *)&(local_70._M_head_impl)->cert_info)->_M_p + 8))();
    }
    if (pbStack_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&pbStack_80,pbStack_80);
    }
    goto LAB_003477b4;
  }
  MakeTestCert((EVP_PKEY *)(local_58 + 8));
  local_88[0] = (X509 *)local_58._8_8_ != (X509 *)0x0;
  pbStack_80 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if ((X509 *)local_58._8_8_ == (X509 *)0x0) {
    testing::Message::Message((Message *)&local_70);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_c0,(internal *)local_88,(AssertionResult *)"cert1","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_a0,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs8/pkcs12_test.cc"
               ,0x233,local_c0._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_a0,(Message *)&local_70);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_a0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
      operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
    }
    if (local_70._M_head_impl != (X509 *)0x0) {
      (**(code **)(((_Alloc_hider *)&(local_70._M_head_impl)->cert_info)->_M_p + 8))();
    }
    if (pbStack_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&pbStack_80,pbStack_80);
    }
  }
  else {
    MakeTestCert((EVP_PKEY *)(local_40 + 8));
    local_88[0] = (X509 *)local_40._8_8_ != (X509 *)0x0;
    pbStack_80 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if ((X509 *)local_40._8_8_ == (X509 *)0x0) {
      testing::Message::Message((Message *)&local_70);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_c0,(internal *)local_88,(AssertionResult *)"cert1b","false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_a0,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs8/pkcs12_test.cc"
                 ,0x235,local_c0._M_dataplus._M_p);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_a0,(Message *)&local_70);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_a0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
        operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
      }
      if (local_70._M_head_impl != (X509 *)0x0) {
        (**(code **)(((_Alloc_hider *)&(local_70._M_head_impl)->cert_info)->_M_p + 8))();
      }
      if (pbStack_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&pbStack_80,pbStack_80);
      }
    }
    else {
      MakeTestKey();
      local_88[0] = local_28._M_t.super___uniq_ptr_impl<evp_pkey_st,_bssl::internal::Deleter>._M_t.
                    super__Tuple_impl<0UL,_evp_pkey_st_*,_bssl::internal::Deleter>.
                    super__Head_base<0UL,_evp_pkey_st_*,_false>._M_head_impl !=
                    (__uniq_ptr_impl<evp_pkey_st,_bssl::internal::Deleter>)0x0;
      pbStack_80 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if (local_28._M_t.super___uniq_ptr_impl<evp_pkey_st,_bssl::internal::Deleter>._M_t.
          super__Tuple_impl<0UL,_evp_pkey_st_*,_bssl::internal::Deleter>.
          super__Head_base<0UL,_evp_pkey_st_*,_false>._M_head_impl ==
          (__uniq_ptr_impl<evp_pkey_st,_bssl::internal::Deleter>)0x0) {
        testing::Message::Message((Message *)&local_70);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  (&local_c0,(internal *)local_88,(AssertionResult *)0x533753,"false","true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_a0,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs8/pkcs12_test.cc"
                   ,0x237,local_c0._M_dataplus._M_p);
        testing::internal::AssertHelper::operator=((AssertHelper *)&local_a0,(Message *)&local_70);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_a0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
          operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
        }
        if (local_70._M_head_impl != (X509 *)0x0) {
          (**(code **)(((_Alloc_hider *)&(local_70._M_head_impl)->cert_info)->_M_p + 8))();
        }
        if (pbStack_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
        {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&pbStack_80,pbStack_80);
        }
      }
      else {
        MakeTestCert((EVP_PKEY *)local_58);
        local_88[0] = (X509 *)local_58._0_8_ != (X509 *)0x0;
        pbStack_80 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        if ((X509 *)local_58._0_8_ == (X509 *)0x0) {
          testing::Message::Message((Message *)&local_70);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    (&local_c0,(internal *)local_88,(AssertionResult *)"cert2","false","true",in_R9)
          ;
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&local_a0,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs8/pkcs12_test.cc"
                     ,0x239,local_c0._M_dataplus._M_p);
          testing::internal::AssertHelper::operator=((AssertHelper *)&local_a0,(Message *)&local_70)
          ;
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_a0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
            operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
          }
          if (local_70._M_head_impl != (X509 *)0x0) {
            (**(code **)(((_Alloc_hider *)&(local_70._M_head_impl)->cert_info)->_M_p + 8))();
          }
          if (pbStack_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
             ) {
            std::
            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&pbStack_80,pbStack_80);
          }
        }
        else {
          MakeTestKey();
          local_88[0] = local_30._M_t.super__Tuple_impl<0UL,_evp_pkey_st_*,_bssl::internal::Deleter>
                        .super__Head_base<0UL,_evp_pkey_st_*,_false>._M_head_impl !=
                        (_Tuple_impl<0UL,_evp_pkey_st_*,_bssl::internal::Deleter>)0x0;
          pbStack_80 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
          if (local_30._M_t.super__Tuple_impl<0UL,_evp_pkey_st_*,_bssl::internal::Deleter>.
              super__Head_base<0UL,_evp_pkey_st_*,_false>._M_head_impl ==
              (_Tuple_impl<0UL,_evp_pkey_st_*,_bssl::internal::Deleter>)0x0) {
            testing::Message::Message((Message *)&local_70);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      (&local_c0,(internal *)local_88,(AssertionResult *)"key3","false","true",in_R9
                      );
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&local_a0,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs8/pkcs12_test.cc"
                       ,0x23b,local_c0._M_dataplus._M_p);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&local_a0,(Message *)&local_70);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_a0);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
              operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
            }
            if (local_70._M_head_impl != (X509 *)0x0) {
              (**(code **)(((_Alloc_hider *)&(local_70._M_head_impl)->cert_info)->_M_p + 8))();
            }
            if (pbStack_80 !=
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              std::
              default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&pbStack_80,pbStack_80);
            }
          }
          else {
            MakeTestCert((EVP_PKEY *)local_40);
            _Var4._M_head_impl = local_48._M_head_impl;
            local_88[0] = (_Head_base<0UL,_x509_st_*,_false>)local_40._0_8_ !=
                          (_Head_base<0UL,_x509_st_*,_false>)0x0;
            pbStack_80 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
            if ((_Head_base<0UL,_x509_st_*,_false>)local_40._0_8_ ==
                (_Head_base<0UL,_x509_st_*,_false>)0x0) {
              testing::Message::Message((Message *)&local_70);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        (&local_c0,(internal *)local_88,(AssertionResult *)"cert3","false","true",
                         in_R9);
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&local_a0,kFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs8/pkcs12_test.cc"
                         ,0x23d,local_c0._M_dataplus._M_p);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&local_a0,(Message *)&local_70);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_a0);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
                operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1
                               );
              }
              if (local_70._M_head_impl != (X509 *)0x0) {
                (**(code **)(((_Alloc_hider *)&(local_70._M_head_impl)->cert_info)->_M_p + 8))();
              }
              if (pbStack_80 !=
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                std::
                default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)&pbStack_80,pbStack_80);
              }
            }
            else {
              local_88 = (undefined1  [8])0x0;
              pbStack_80 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
              local_78 = (pointer)0x0;
              local_70._M_head_impl = (x509_st *)local_58._8_8_;
              local_68._M_head_impl = (x509_st *)local_58._0_8_;
              local_60._M_head_impl = (x509_st *)local_40._0_8_;
              __l._M_len = 3;
              __l._M_array = &local_70._M_head_impl;
              std::vector<x509_st_*,_std::allocator<x509_st_*>_>::vector
                        ((vector<x509_st_*,_std::allocator<x509_st_*>_> *)&local_c0,__l,
                         (allocator_type *)&local_90);
              bVar5 = PKCS12CreateVector((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                         local_88,_Var4._M_head_impl,
                                         (vector<x509_st_*,_std::allocator<x509_st_*>_> *)&local_c0)
              ;
              local_a0._M_head_impl._0_1_ = bVar5;
              local_98._M_head_impl = (X509 *)0x0;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_c0._M_dataplus._M_p ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)0x0) {
                if (bVar5) goto LAB_00346b5f;
LAB_003475e0:
                testing::Message::Message((Message *)&local_70);
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          (&local_c0,(internal *)&local_a0,
                           (AssertionResult *)
                           "PKCS12CreateVector(&p12, key1.get(), {cert1.get(), cert2.get(), cert3.get()})"
                           ,"false","true",in_R9);
                testing::internal::AssertHelper::AssertHelper
                          (&local_90,kFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs8/pkcs12_test.cc"
                           ,0x242,local_c0._M_dataplus._M_p);
                testing::internal::AssertHelper::operator=(&local_90,(Message *)&local_70);
LAB_0034770e:
                this_00 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)&local_98;
                testing::internal::AssertHelper::~AssertHelper(&local_90);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
                  operator_delete(local_c0._M_dataplus._M_p,
                                  local_c0.field_2._M_allocated_capacity + 1);
                }
                __ptr_00._M_head_impl = local_98._M_head_impl;
                if (local_70._M_head_impl != (X509 *)0x0) {
                  (**(code **)(((_Alloc_hider *)&(local_70._M_head_impl)->cert_info)->_M_p + 8))();
                  __ptr_00._M_head_impl = local_98._M_head_impl;
                }
LAB_00347748:
                if (__ptr_00._M_head_impl != (X509 *)0x0) {
                  std::
                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::operator()(this_00,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)__ptr_00._M_head_impl);
                }
              }
              else {
                operator_delete(local_c0._M_dataplus._M_p,
                                local_c0.field_2._M_allocated_capacity -
                                (long)local_c0._M_dataplus._M_p);
                if (((ulong)local_a0._M_head_impl & 1) == 0) goto LAB_003475e0;
LAB_00346b5f:
                if (local_98._M_head_impl != (X509 *)0x0) {
                  std::
                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                *)&local_98,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_98._M_head_impl);
                }
                _Var4._M_head_impl = local_48._M_head_impl;
                uVar3 = local_58._8_8_;
                pbVar2 = pbStack_80;
                auVar1 = local_88;
                local_70._M_head_impl = (x509_st *)local_58._0_8_;
                local_68._M_head_impl = (x509_st *)local_40._0_8_;
                __l_00._M_len = 2;
                __l_00._M_array = &local_70._M_head_impl;
                std::vector<x509_st_*,_std::allocator<x509_st_*>_>::vector
                          ((vector<x509_st_*,_std::allocator<x509_st_*>_> *)&local_c0,__l_00,
                           (allocator_type *)&local_a0);
                in.size_ = (long)pbVar2 - (long)auVar1;
                in.data_ = (uchar *)auVar1;
                ExpectPKCS12Parse(in,_Var4._M_head_impl,(X509 *)uVar3,
                                  (vector<x509_st_*,_std::allocator<x509_st_*>_> *)&local_c0);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_c0._M_dataplus._M_p !=
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)0x0) {
                  operator_delete(local_c0._M_dataplus._M_p,
                                  local_c0.field_2._M_allocated_capacity -
                                  (long)local_c0._M_dataplus._M_p);
                }
                _Var4._M_head_impl = local_48._M_head_impl;
                local_70._M_head_impl = (x509_st *)local_40._0_8_;
                local_68._M_head_impl = (x509_st *)local_58._8_8_;
                local_60._M_head_impl = (x509_st *)local_58._0_8_;
                __l_01._M_len = 3;
                __l_01._M_array = &local_70._M_head_impl;
                std::vector<x509_st_*,_std::allocator<x509_st_*>_>::vector
                          ((vector<x509_st_*,_std::allocator<x509_st_*>_> *)&local_c0,__l_01,
                           (allocator_type *)&local_90);
                bVar5 = PKCS12CreateVector((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                           local_88,_Var4._M_head_impl,
                                           (vector<x509_st_*,_std::allocator<x509_st_*>_> *)
                                           &local_c0);
                local_a0._M_head_impl._0_1_ = bVar5;
                local_98._M_head_impl = (X509 *)0x0;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_c0._M_dataplus._M_p !=
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)0x0) {
                  operator_delete(local_c0._M_dataplus._M_p,
                                  local_c0.field_2._M_allocated_capacity -
                                  (long)local_c0._M_dataplus._M_p);
                  if (((ulong)local_a0._M_head_impl & 1) != 0) goto LAB_00346c6b;
LAB_0034764a:
                  testing::Message::Message((Message *)&local_70);
                  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                            (&local_c0,(internal *)&local_a0,
                             (AssertionResult *)
                             "PKCS12CreateVector(&p12, key1.get(), {cert3.get(), cert1.get(), cert2.get()})"
                             ,"false","true",in_R9);
                  testing::internal::AssertHelper::AssertHelper
                            (&local_90,kFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs8/pkcs12_test.cc"
                             ,0x246,local_c0._M_dataplus._M_p);
                  testing::internal::AssertHelper::operator=(&local_90,(Message *)&local_70);
                  goto LAB_0034770e;
                }
                if (!bVar5) goto LAB_0034764a;
LAB_00346c6b:
                if (local_98._M_head_impl != (X509 *)0x0) {
                  std::
                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                *)&local_98,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_98._M_head_impl);
                }
                _Var4._M_head_impl = local_48._M_head_impl;
                uVar3 = local_58._8_8_;
                pbVar2 = pbStack_80;
                auVar1 = local_88;
                local_70._M_head_impl = (x509_st *)local_40._0_8_;
                local_68._M_head_impl = (x509_st *)local_58._0_8_;
                __l_02._M_len = 2;
                __l_02._M_array = &local_70._M_head_impl;
                std::vector<x509_st_*,_std::allocator<x509_st_*>_>::vector
                          ((vector<x509_st_*,_std::allocator<x509_st_*>_> *)&local_c0,__l_02,
                           (allocator_type *)&local_a0);
                in_00.size_ = (long)pbVar2 - (long)auVar1;
                in_00.data_ = (uchar *)auVar1;
                ExpectPKCS12Parse(in_00,_Var4._M_head_impl,(X509 *)uVar3,
                                  (vector<x509_st_*,_std::allocator<x509_st_*>_> *)&local_c0);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_c0._M_dataplus._M_p !=
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)0x0) {
                  operator_delete(local_c0._M_dataplus._M_p,
                                  local_c0.field_2._M_allocated_capacity -
                                  (long)local_c0._M_dataplus._M_p);
                }
                _Var4._M_head_impl = local_48._M_head_impl;
                local_70._M_head_impl = (x509_st *)local_58._0_8_;
                local_68._M_head_impl = (x509_st *)local_40._0_8_;
                local_60._M_head_impl = (x509_st *)local_58._8_8_;
                __l_03._M_len = 3;
                __l_03._M_array = &local_70._M_head_impl;
                std::vector<x509_st_*,_std::allocator<x509_st_*>_>::vector
                          ((vector<x509_st_*,_std::allocator<x509_st_*>_> *)&local_c0,__l_03,
                           (allocator_type *)&local_90);
                bVar5 = PKCS12CreateVector((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                           local_88,_Var4._M_head_impl,
                                           (vector<x509_st_*,_std::allocator<x509_st_*>_> *)
                                           &local_c0);
                local_a0._M_head_impl._0_1_ = bVar5;
                local_98._M_head_impl = (X509 *)0x0;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_c0._M_dataplus._M_p ==
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)0x0) {
                  if (!bVar5) goto LAB_003476b1;
                }
                else {
                  operator_delete(local_c0._M_dataplus._M_p,
                                  local_c0.field_2._M_allocated_capacity -
                                  (long)local_c0._M_dataplus._M_p);
                  if (((ulong)local_a0._M_head_impl & 1) == 0) {
LAB_003476b1:
                    testing::Message::Message((Message *)&local_70);
                    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                              (&local_c0,(internal *)&local_a0,
                               (AssertionResult *)
                               "PKCS12CreateVector(&p12, key1.get(), {cert2.get(), cert3.get(), cert1.get()})"
                               ,"false","true",in_R9);
                    testing::internal::AssertHelper::AssertHelper
                              (&local_90,kFatalFailure,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs8/pkcs12_test.cc"
                               ,0x24a,local_c0._M_dataplus._M_p);
                    testing::internal::AssertHelper::operator=(&local_90,(Message *)&local_70);
                    goto LAB_0034770e;
                  }
                }
                if (local_98._M_head_impl != (X509 *)0x0) {
                  std::
                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                *)&local_98,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_98._M_head_impl);
                }
                _Var4._M_head_impl = local_48._M_head_impl;
                uVar3 = local_58._8_8_;
                pbVar2 = pbStack_80;
                auVar1 = local_88;
                local_70._M_head_impl = (x509_st *)local_58._0_8_;
                local_68._M_head_impl = (x509_st *)local_40._0_8_;
                __l_04._M_len = 2;
                __l_04._M_array = &local_70._M_head_impl;
                std::vector<x509_st_*,_std::allocator<x509_st_*>_>::vector
                          ((vector<x509_st_*,_std::allocator<x509_st_*>_> *)&local_c0,__l_04,
                           (allocator_type *)&local_a0);
                in_01.size_ = (long)pbVar2 - (long)auVar1;
                in_01.data_ = (uchar *)auVar1;
                ExpectPKCS12Parse(in_01,_Var4._M_head_impl,(X509 *)uVar3,
                                  (vector<x509_st_*,_std::allocator<x509_st_*>_> *)&local_c0);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_c0._M_dataplus._M_p !=
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)0x0) {
                  operator_delete(local_c0._M_dataplus._M_p,
                                  local_c0.field_2._M_allocated_capacity -
                                  (long)local_c0._M_dataplus._M_p);
                }
                _Var4._M_head_impl = local_48._M_head_impl;
                local_a0._M_head_impl = (x509_st *)local_58._8_8_;
                local_98._M_head_impl = (x509_st *)local_40._8_8_;
                __l_05._M_len = 2;
                __l_05._M_array = &local_a0._M_head_impl;
                std::vector<x509_st_*,_std::allocator<x509_st_*>_>::vector
                          ((vector<x509_st_*,_std::allocator<x509_st_*>_> *)&local_c0,__l_05,
                           (allocator_type *)&local_90);
                bVar5 = PKCS12CreateVector((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                           local_88,_Var4._M_head_impl,
                                           (vector<x509_st_*,_std::allocator<x509_st_*>_> *)
                                           &local_c0);
                local_70._M_head_impl._0_1_ = bVar5;
                local_68._M_head_impl = (X509 *)0x0;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_c0._M_dataplus._M_p ==
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)0x0) {
                  if (bVar5) goto LAB_00346e7a;
LAB_003477d8:
                  testing::Message::Message((Message *)&local_a0);
                  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                            (&local_c0,(internal *)&local_70,
                             (AssertionResult *)
                             "PKCS12CreateVector(&p12, key1.get(), {cert1.get(), cert1b.get()})",
                             "false","true",in_R9);
                  testing::internal::AssertHelper::AssertHelper
                            (&local_90,kFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs8/pkcs12_test.cc"
                             ,0x250,local_c0._M_dataplus._M_p);
                  testing::internal::AssertHelper::operator=(&local_90,(Message *)&local_a0);
LAB_00347835:
                  this_00 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)&local_68;
                  testing::internal::AssertHelper::~AssertHelper(&local_90);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
                    operator_delete(local_c0._M_dataplus._M_p,
                                    local_c0.field_2._M_allocated_capacity + 1);
                  }
                  __ptr_00._M_head_impl = local_68._M_head_impl;
                  if (local_a0._M_head_impl != (X509 *)0x0) {
                    (**(code **)(((_Alloc_hider *)&(local_a0._M_head_impl)->cert_info)->_M_p + 8))()
                    ;
                    __ptr_00._M_head_impl = local_68._M_head_impl;
                  }
                  goto LAB_00347748;
                }
                operator_delete(local_c0._M_dataplus._M_p,
                                local_c0.field_2._M_allocated_capacity -
                                (long)local_c0._M_dataplus._M_p);
                if (((ulong)local_70._M_head_impl & 1) == 0) goto LAB_003477d8;
LAB_00346e7a:
                if (local_68._M_head_impl != (X509 *)0x0) {
                  std::
                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                *)&local_68,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_68._M_head_impl);
                }
                _Var4._M_head_impl = local_48._M_head_impl;
                pbVar2 = pbStack_80;
                auVar1 = local_88;
                local_70._M_head_impl = (x509_st *)local_58._8_8_;
                __l_06._M_len = 1;
                __l_06._M_array = &local_70._M_head_impl;
                std::vector<x509_st_*,_std::allocator<x509_st_*>_>::vector
                          ((vector<x509_st_*,_std::allocator<x509_st_*>_> *)&local_c0,__l_06,
                           (allocator_type *)&local_a0);
                in_02.size_ = (long)pbVar2 - (long)auVar1;
                in_02.data_ = (uchar *)auVar1;
                ExpectPKCS12Parse(in_02,_Var4._M_head_impl,(X509 *)local_40._8_8_,
                                  (vector<x509_st_*,_std::allocator<x509_st_*>_> *)&local_c0);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_c0._M_dataplus._M_p !=
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)0x0) {
                  operator_delete(local_c0._M_dataplus._M_p,
                                  local_c0.field_2._M_allocated_capacity -
                                  (long)local_c0._M_dataplus._M_p);
                }
                local_70._M_head_impl = (x509_st *)local_58._8_8_;
                local_68._M_head_impl = (x509_st *)local_58._0_8_;
                local_60._M_head_impl = (x509_st *)local_40._0_8_;
                __l_07._M_len = 3;
                __l_07._M_array = &local_70._M_head_impl;
                std::vector<x509_st_*,_std::allocator<x509_st_*>_>::vector
                          ((vector<x509_st_*,_std::allocator<x509_st_*>_> *)&local_c0,__l_07,
                           (allocator_type *)&local_90);
                bVar5 = PKCS12CreateVector((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                           local_88,(EVP_PKEY *)0x0,
                                           (vector<x509_st_*,_std::allocator<x509_st_*>_> *)
                                           &local_c0);
                local_a0._M_head_impl._0_1_ = bVar5;
                local_98._M_head_impl = (X509 *)0x0;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_c0._M_dataplus._M_p ==
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)0x0) {
                  if (!bVar5) goto LAB_0034787c;
                }
                else {
                  operator_delete(local_c0._M_dataplus._M_p,
                                  local_c0.field_2._M_allocated_capacity -
                                  (long)local_c0._M_dataplus._M_p);
                  if (((ulong)local_a0._M_head_impl & 1) == 0) {
LAB_0034787c:
                    testing::Message::Message((Message *)&local_70);
                    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                              (&local_c0,(internal *)&local_a0,
                               (AssertionResult *)
                               "PKCS12CreateVector(&p12, nullptr, {cert1.get(), cert2.get(), cert3.get()})"
                               ,"false","true",in_R9);
                    testing::internal::AssertHelper::AssertHelper
                              (&local_90,kFatalFailure,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs8/pkcs12_test.cc"
                               ,0x255,local_c0._M_dataplus._M_p);
                    testing::internal::AssertHelper::operator=(&local_90,(Message *)&local_70);
                    goto LAB_0034770e;
                  }
                }
                if (local_98._M_head_impl != (X509 *)0x0) {
                  std::
                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                *)&local_98,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_98._M_head_impl);
                }
                pbVar2 = pbStack_80;
                auVar1 = local_88;
                local_70._M_head_impl = (x509_st *)local_58._8_8_;
                local_68._M_head_impl = (x509_st *)local_58._0_8_;
                local_60._M_head_impl = (x509_st *)local_40._0_8_;
                __l_08._M_len = 3;
                __l_08._M_array = &local_70._M_head_impl;
                std::vector<x509_st_*,_std::allocator<x509_st_*>_>::vector
                          ((vector<x509_st_*,_std::allocator<x509_st_*>_> *)&local_c0,__l_08,
                           (allocator_type *)&local_a0);
                in_03.size_ = (long)pbVar2 - (long)auVar1;
                in_03.data_ = (uchar *)auVar1;
                ExpectPKCS12Parse(in_03,(EVP_PKEY *)0x0,(X509 *)0x0,
                                  (vector<x509_st_*,_std::allocator<x509_st_*>_> *)&local_c0);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_c0._M_dataplus._M_p !=
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)0x0) {
                  operator_delete(local_c0._M_dataplus._M_p,
                                  local_c0.field_2._M_allocated_capacity -
                                  (long)local_c0._M_dataplus._M_p);
                }
                _Var4._M_head_impl = local_48._M_head_impl;
                local_a0._M_head_impl = (x509_st *)local_58._0_8_;
                local_98._M_head_impl = (x509_st *)local_40._0_8_;
                __l_09._M_len = 2;
                __l_09._M_array = &local_a0._M_head_impl;
                std::vector<x509_st_*,_std::allocator<x509_st_*>_>::vector
                          ((vector<x509_st_*,_std::allocator<x509_st_*>_> *)&local_c0,__l_09,
                           (allocator_type *)&local_90);
                bVar5 = PKCS12CreateVector((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                           local_88,_Var4._M_head_impl,
                                           (vector<x509_st_*,_std::allocator<x509_st_*>_> *)
                                           &local_c0);
                local_70._M_head_impl._0_1_ = bVar5;
                local_68._M_head_impl = (X509 *)0x0;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_c0._M_dataplus._M_p ==
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)0x0) {
                  if (!bVar5) goto LAB_003478e6;
                }
                else {
                  operator_delete(local_c0._M_dataplus._M_p,
                                  local_c0.field_2._M_allocated_capacity -
                                  (long)local_c0._M_dataplus._M_p);
                  if (((ulong)local_70._M_head_impl & 1) == 0) {
LAB_003478e6:
                    testing::Message::Message((Message *)&local_a0);
                    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                              (&local_c0,(internal *)&local_70,
                               (AssertionResult *)
                               "PKCS12CreateVector(&p12, key1.get(), {cert2.get(), cert3.get()})",
                               "false","true",in_R9);
                    testing::internal::AssertHelper::AssertHelper
                              (&local_90,kFatalFailure,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs8/pkcs12_test.cc"
                               ,0x25a,local_c0._M_dataplus._M_p);
                    testing::internal::AssertHelper::operator=(&local_90,(Message *)&local_a0);
                    goto LAB_00347835;
                  }
                }
                if (local_68._M_head_impl != (X509 *)0x0) {
                  std::
                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                *)&local_68,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_68._M_head_impl);
                }
                pbVar2 = pbStack_80;
                auVar1 = local_88;
                local_70._M_head_impl = (x509_st *)local_58._0_8_;
                local_68._M_head_impl = (x509_st *)local_40._0_8_;
                __l_10._M_len = 2;
                __l_10._M_array = &local_70._M_head_impl;
                std::vector<x509_st_*,_std::allocator<x509_st_*>_>::vector
                          ((vector<x509_st_*,_std::allocator<x509_st_*>_> *)&local_c0,__l_10,
                           (allocator_type *)&local_a0);
                in_04.size_ = (long)pbVar2 - (long)auVar1;
                in_04.data_ = (uchar *)auVar1;
                ExpectPKCS12Parse(in_04,local_48._M_head_impl,(X509 *)0x0,
                                  (vector<x509_st_*,_std::allocator<x509_st_*>_> *)&local_c0);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_c0._M_dataplus._M_p !=
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)0x0) {
                  operator_delete(local_c0._M_dataplus._M_p,
                                  local_c0.field_2._M_allocated_capacity -
                                  (long)local_c0._M_dataplus._M_p);
                }
              }
              if (local_88 != (undefined1  [8])0x0) {
                operator_delete((void *)local_88,(long)local_78 - (long)local_88);
              }
            }
            std::unique_ptr<x509_st,_bssl::internal::Deleter>::~unique_ptr
                      ((unique_ptr<x509_st,_bssl::internal::Deleter> *)local_40);
          }
          std::unique_ptr<evp_pkey_st,_bssl::internal::Deleter>::~unique_ptr
                    ((unique_ptr<evp_pkey_st,_bssl::internal::Deleter> *)&local_30);
        }
        std::unique_ptr<x509_st,_bssl::internal::Deleter>::~unique_ptr
                  ((unique_ptr<x509_st,_bssl::internal::Deleter> *)local_58);
      }
      std::unique_ptr<evp_pkey_st,_bssl::internal::Deleter>::~unique_ptr(&local_28);
    }
    std::unique_ptr<x509_st,_bssl::internal::Deleter>::~unique_ptr
              ((unique_ptr<x509_st,_bssl::internal::Deleter> *)(local_40 + 8));
  }
  std::unique_ptr<x509_st,_bssl::internal::Deleter>::~unique_ptr
            ((unique_ptr<x509_st,_bssl::internal::Deleter> *)(local_58 + 8));
LAB_003477b4:
  std::unique_ptr<evp_pkey_st,_bssl::internal::Deleter>::~unique_ptr
            ((unique_ptr<evp_pkey_st,_bssl::internal::Deleter> *)&local_48);
  return;
}

Assistant:

TEST(PKCS12Test, Order) {
  bssl::UniquePtr<EVP_PKEY> key1 = MakeTestKey();
  ASSERT_TRUE(key1);
  bssl::UniquePtr<X509> cert1 = MakeTestCert(key1.get());
  ASSERT_TRUE(cert1);
  bssl::UniquePtr<X509> cert1b = MakeTestCert(key1.get());
  ASSERT_TRUE(cert1b);
  bssl::UniquePtr<EVP_PKEY> key2 = MakeTestKey();
  ASSERT_TRUE(key2);
  bssl::UniquePtr<X509> cert2 = MakeTestCert(key2.get());
  ASSERT_TRUE(cert2);
  bssl::UniquePtr<EVP_PKEY> key3 = MakeTestKey();
  ASSERT_TRUE(key3);
  bssl::UniquePtr<X509> cert3 = MakeTestCert(key3.get());
  ASSERT_TRUE(cert3);

  // PKCS12_parse uses the key to select the main certificate.
  std::vector<uint8_t> p12;
  ASSERT_TRUE(PKCS12CreateVector(&p12, key1.get(),
                                 {cert1.get(), cert2.get(), cert3.get()}));
  ExpectPKCS12Parse(p12, key1.get(), cert1.get(), {cert2.get(), cert3.get()});

  ASSERT_TRUE(PKCS12CreateVector(&p12, key1.get(),
                                 {cert3.get(), cert1.get(), cert2.get()}));
  ExpectPKCS12Parse(p12, key1.get(), cert1.get(), {cert3.get(), cert2.get()});

  ASSERT_TRUE(PKCS12CreateVector(&p12, key1.get(),
                                 {cert2.get(), cert3.get(), cert1.get()}));
  ExpectPKCS12Parse(p12, key1.get(), cert1.get(), {cert2.get(), cert3.get()});

  // In case of duplicates, the last one is selected. (It is unlikely anything
  // depends on which is selected, but we match OpenSSL.)
  ASSERT_TRUE(
      PKCS12CreateVector(&p12, key1.get(), {cert1.get(), cert1b.get()}));
  ExpectPKCS12Parse(p12, key1.get(), cert1b.get(), {cert1.get()});

  // If there is no key, all certificates are returned as "CA" certificates.
  ASSERT_TRUE(PKCS12CreateVector(&p12, nullptr,
                                 {cert1.get(), cert2.get(), cert3.get()}));
  ExpectPKCS12Parse(p12, nullptr, nullptr,
                    {cert1.get(), cert2.get(), cert3.get()});

  // The same happens if there is a key, but it does not match any certificate.
  ASSERT_TRUE(PKCS12CreateVector(&p12, key1.get(), {cert2.get(), cert3.get()}));
  ExpectPKCS12Parse(p12, key1.get(), nullptr, {cert2.get(), cert3.get()});
}